

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall QSynth::resetMIDIChannelsAssignment(QSynth *this,bool engageChannel1)

{
  QMutexLocker<QMutex> synthLocker;
  QMutexLocker<QMutex> local_20;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::resetMidiChannelsAssignment(this->realtimeHelper,engageChannel1);
    return;
  }
  QMutexLocker<QMutex>::QMutexLocker(&local_20,this->synthMutex);
  if (this->state == SynthState_OPEN) {
    writeMIDIChannelsAssignmentResetSysex(this->synth,engageChannel1);
  }
  QMutexLocker<QMutex>::unlock(&local_20);
  return;
}

Assistant:

void QSynth::resetMIDIChannelsAssignment(bool engageChannel1) {
	if (isRealtime()) {
		realtimeHelper->resetMidiChannelsAssignment(engageChannel1);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) writeMIDIChannelsAssignmentResetSysex(synth, engageChannel1);
	}
}